

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O0

work_item * wait_for_completion(thread_pool *thread_pool,size_t count)

{
  work_item *pwVar1;
  _Bool _Var2;
  int iVar3;
  work_item *done_items;
  work_queue *queue;
  size_t count_local;
  thread_pool *thread_pool_local;
  
  mtx_lock(&(thread_pool->queue).mutex);
  (thread_pool->queue).done_target = count;
  do {
    _Var2 = waiting_condition(&thread_pool->queue);
    if (!_Var2) break;
    iVar3 = cnd_wait(&(thread_pool->queue).done_cond,&(thread_pool->queue).mutex);
  } while (iVar3 == 0);
  pwVar1 = (thread_pool->queue).done_items;
  (thread_pool->queue).done_items = (work_item *)0x0;
  (thread_pool->queue).done_count = 0;
  (thread_pool->queue).done_target = 0;
  mtx_unlock(&(thread_pool->queue).mutex);
  return pwVar1;
}

Assistant:

struct work_item* wait_for_completion(struct thread_pool* thread_pool, size_t count) {
    struct work_queue* queue = &thread_pool->queue;
    struct work_item* done_items = NULL;
    mtx_lock(&queue->mutex);
    queue->done_target = count;
    while (true) {
        if (waiting_condition(queue) &&
            cnd_wait(&queue->done_cond, &queue->mutex) == thrd_success)
            continue;
        break;
    }
    done_items = queue->done_items;
    queue->done_items = NULL;
    queue->done_count = 0;
    queue->done_target = 0;
    mtx_unlock(&queue->mutex);
    return done_items;
}